

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroup.cxx
# Opt level: O3

cmSourceGroup * __thiscall cmSourceGroup::MatchChildrenFiles(cmSourceGroup *this,string *name)

{
  cmSourceGroupInternals *pcVar1;
  pointer pcVar2;
  const_iterator cVar3;
  cmSourceGroup *group;
  cmSourceGroup *this_00;
  
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->GroupFiles)._M_t,name);
  if ((_Rb_tree_header *)cVar3._M_node == &(this->GroupFiles)._M_t._M_impl.super__Rb_tree_header) {
    pcVar1 = (this->Internal)._M_t.
             super___uniq_ptr_impl<cmSourceGroupInternals,_std::default_delete<cmSourceGroupInternals>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmSourceGroupInternals_*,_std::default_delete<cmSourceGroupInternals>_>
             .super__Head_base<0UL,_cmSourceGroupInternals_*,_false>._M_head_impl;
    this_00 = *(cmSourceGroup **)
               &(pcVar1->GroupChildren).
                super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>;
    pcVar2 = *(pointer *)
              ((long)&(pcVar1->GroupChildren).
                      super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_> + 8);
    while ((this = (cmSourceGroup *)0x0, this_00 != pcVar2 &&
           (this = MatchChildrenFiles(this_00,name), this == (cmSourceGroup *)0x0))) {
      this_00 = this_00 + 1;
    }
  }
  return this;
}

Assistant:

cmSourceGroup* cmSourceGroup::MatchChildrenFiles(const std::string& name)
{
  if (this->MatchesFiles(name)) {
    return this;
  }
  for (cmSourceGroup& group : this->Internal->GroupChildren) {
    cmSourceGroup* result = group.MatchChildrenFiles(name);
    if (result) {
      return result;
    }
  }
  return nullptr;
}